

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_schema_features.c
# Opt level: O0

void print_features(ly_out *out,lys_module *mod)

{
  undefined8 uVar1;
  lys_module *plVar2;
  int iVar3;
  char *pcVar4;
  size_t local_40;
  size_t len;
  size_t max_len;
  undefined8 *puStack_20;
  uint32_t idx;
  lysp_feature *f;
  lys_module *mod_local;
  ly_out *out_local;
  
  f = (lysp_feature *)mod;
  mod_local = (lys_module *)out;
  ly_print(out,"%s:\n",mod->name);
  len = 0;
  max_len._4_4_ = 0;
  puStack_20 = (undefined8 *)0x0;
  while (puStack_20 = (undefined8 *)
                      lysp_feature_next(puStack_20,f[1].iffeatures_c,(long)&max_len + 4),
        puStack_20 != (undefined8 *)0x0) {
    local_40 = strlen((char *)*puStack_20);
    if (local_40 < len) {
      local_40 = len;
    }
    len = local_40;
  }
  if (len == 0) {
    ly_print(mod_local,"\t(none)\n");
  }
  else {
    max_len._4_4_ = 0;
    puStack_20 = (undefined8 *)0x0;
    while (puStack_20 = (undefined8 *)
                        lysp_feature_next(puStack_20,f[1].iffeatures_c,(long)&max_len + 4),
          plVar2 = mod_local, puStack_20 != (undefined8 *)0x0) {
      uVar1 = *puStack_20;
      iVar3 = lys_feature_value(f,*puStack_20);
      pcVar4 = "on";
      if (iVar3 != 0) {
        pcVar4 = "off";
      }
      ly_print(plVar2,"\t%-*s (%s)\n",len & 0xffffffff,uVar1,pcVar4);
    }
  }
  return;
}

Assistant:

void
print_features(struct ly_out *out, const struct lys_module *mod)
{
    struct lysp_feature *f;
    uint32_t idx;
    size_t max_len, len;

    ly_print(out, "%s:\n", mod->name);

    /* get max len, so the statuses of all the features will be aligned */
    max_len = 0, idx = 0, f = NULL;
    while ((f = lysp_feature_next(f, mod->parsed, &idx))) {
        len = strlen(f->name);
        max_len = (max_len > len) ? max_len : len;
    }
    if (!max_len) {
        ly_print(out, "\t(none)\n");
        return;
    }

    /* print features */
    idx = 0, f = NULL;
    while ((f = lysp_feature_next(f, mod->parsed, &idx))) {
        ly_print(out, "\t%-*s (%s)\n", (int)max_len, f->name, lys_feature_value(mod, f->name) ? "off" : "on");
    }
}